

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 __thiscall simd_test_avx2::c_imm_v128_shl_n_8<5>(simd_test_avx2 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  c_v128 cVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[0];
  auVar1 = vpsllw_avx(auVar1,5);
  auVar3[8] = 0xe0;
  auVar3._0_8_ = 0xe0e0e0e0e0e0e0e0;
  auVar3[9] = 0xe0;
  auVar3[10] = 0xe0;
  auVar3[0xb] = 0xe0;
  auVar3[0xc] = 0xe0;
  auVar3[0xd] = 0xe0;
  auVar3[0xe] = 0xe0;
  auVar3[0xf] = 0xe0;
  auVar1 = vpand_avx(auVar1,auVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this;
  auVar2 = vpsllw_avx(auVar2,5);
  auVar2 = vpand_avx(auVar2,auVar3);
  cVar4.u64[1] = auVar1._0_8_;
  cVar4.u64[0] = auVar2._0_8_;
  return cVar4;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = (int8_t)(a.u8[c] << n);
  return t;
}